

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::VisibleSurface::VisibleSurface
          (VisibleSurface *this,SurfaceInteraction *si,CameraTransform *cameraTransform,
          SampledSpectrum *albedo,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  long in_RSI;
  undefined1 *in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar12;
  Point3f PVar13;
  Point3<float> PVar14;
  Vector3<float> VVar15;
  Normal3<float> NVar16;
  Vector3f wo;
  Transform cameraFromRender;
  Interaction *in_stack_fffffffffffffe20;
  Vector3<float> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffea8;
  Float time;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Normal3<float> *n;
  undefined4 in_stack_ffffffffffffff34;
  Point3<float> *in_stack_ffffffffffffffc8;
  Transform *in_stack_ffffffffffffffd0;
  undefined1 auVar11 [56];
  
  time = (Float)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  *in_RDI = 0;
  Point3<float>::Point3((Point3<float> *)0x759548);
  Normal3<float>::Normal3((Normal3<float> *)0x759556);
  Normal3<float>::Normal3((Normal3<float> *)0x759564);
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  uVar1 = in_RCX[1];
  *(undefined8 *)(in_RDI + 0x34) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x3c) = uVar1;
  *in_RDI = 1;
  auVar11 = (undefined1  [56])0x0;
  CameraTransform::CameraFromRender
            ((CameraTransform *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),time);
  PVar13 = Interaction::p(in_stack_fffffffffffffe20);
  fVar12 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar11;
  n = (Normal3<float> *)vmovlpd_avx(auVar2._0_16_);
  PVar14 = Transform::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  auVar3._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar11;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  *(float *)(in_RDI + 0xc) = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  *(undefined8 *)(in_RDI + 4) = uVar1;
  VVar15 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_ffffffffffffff34,fVar12),(Vector3<float> *)n);
  auVar4._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar11;
  vmovlpd_avx(auVar4._0_16_);
  NVar16 = Transform::operator()((Transform *)CONCAT44(in_stack_ffffffffffffff34,fVar12),n);
  auVar5._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar11;
  vmovlpd_avx(auVar5._0_16_);
  NVar16 = FaceForward<float>((Normal3<float> *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe38);
  auVar6._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar11;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  *(float *)(in_RDI + 0x18) = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
  *(undefined8 *)(in_RDI + 0x10) = uVar1;
  NVar16 = Transform::operator()((Transform *)CONCAT44(in_stack_ffffffffffffff34,fVar12),n);
  auVar7._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  vmovlpd_avx(auVar7._0_16_);
  NVar16 = FaceForward<float>((Normal3<float> *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe38);
  auVar8._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  *(float *)(in_RDI + 0x24) = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
  *(undefined8 *)(in_RDI + 0x1c) = uVar1;
  auVar11 = (undefined1  [56])0x0;
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RSI + 0x18);
  VVar15 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_ffffffffffffff34,fVar12),(Vector3<float> *)n);
  auVar9._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  vmovlpd_avx(auVar9._0_16_);
  auVar11 = (undefined1  [56])0x0;
  *(float *)(in_RDI + 0x2c) = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar15 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_ffffffffffffff34,fVar12),(Vector3<float> *)n);
  auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  vmovlpd_avx(auVar10._0_16_);
  *(float *)(in_RDI + 0x30) = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  return;
}

Assistant:

VisibleSurface::VisibleSurface(const SurfaceInteraction &si,
                               const CameraTransform &cameraTransform,
                               const SampledSpectrum &albedo,
                               const SampledWavelengths &lambda)
    : albedo(albedo) {
    set = true;
    // Initialize geometric _VisibleSurface_ members
    Transform cameraFromRender = cameraTransform.CameraFromRender(si.time);
    p = cameraFromRender(si.p());
    Vector3f wo = cameraFromRender(si.wo);
    n = FaceForward(cameraFromRender(si.n), wo);
    ns = FaceForward(cameraFromRender(si.shading.n), wo);
    time = si.time;
    dzdx = cameraFromRender(si.dpdx).z;
    dzdy = cameraFromRender(si.dpdy).z;
}